

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O2

void __thiscall
doctest::AssertData::StringContains::StringContains(StringContains *this,StringContains *param_1)

{
  EVP_PKEY_CTX *in_RDX;
  
  String::copy((String *)this,(EVP_PKEY_CTX *)param_1,in_RDX);
  this->isContains = param_1->isContains;
  return;
}

Assistant:

class DOCTEST_INTERFACE StringContains {
        private:
            Contains content;
            bool isContains;

        public:
            StringContains(const String& str) : content(str), isContains(false) { }
            StringContains(Contains cntn) : content(static_cast<Contains&&>(cntn)), isContains(true) { }

            bool check(const String& str) { return isContains ? (content == str) : (content.string == str); }

            operator const String&() const { return content.string; }

            const char* c_str() const { return content.string.c_str(); }
    }